

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

void __thiscall cmUVProcessChain::cmUVProcessChain(cmUVProcessChain *this)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> __s;
  pointer *__ptr;
  
  __s._M_head_impl = (InternalData *)operator_new(0x3a0);
  memset(__s._M_head_impl,0,0x3a0);
  InternalData::StreamData<std::basic_istream<char,_std::char_traits<char>_>_>::StreamData
            (&(__s._M_head_impl)->OutputStreamData);
  InternalData::StreamData<std::basic_istream<char,_std::char_traits<char>_>_>::StreamData
            (&(__s._M_head_impl)->ErrorStreamData);
  (__s._M_head_impl)->ProcessesCompleted = 0;
  *(undefined8 *)
   &((__s._M_head_impl)->Processes).
    super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
       = 0;
  *(pointer *)((long)&(__s._M_head_impl)->Processes + 8) = (pointer)0x0;
  *(pointer *)((long)&(__s._M_head_impl)->Processes + 0x10) = (pointer)0x0;
  (this->Data)._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl = __s._M_head_impl;
  ::cm::uv_loop_ptr::init(&(__s._M_head_impl)->Loop,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

cmUVProcessChain::cmUVProcessChain()
  : Data(cm::make_unique<InternalData>())
{
  this->Data->Loop.init();
}